

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_ManMultiAig_rec(Dam_Man_t *pMan,Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  
  if (pObj->Value == 0xffffffff) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                    ,0x2f6,
                    "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjId(p,pObj);
    piVar5 = Dam_ObjSet(pMan,iVar1);
    if (piVar5 == (int *)0x0) {
      Dam_ManMultiAig_rec(pMan,pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      Dam_ManMultiAig_rec(pMan,pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar1 = Gia_ObjIsMux(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsXor(pObj);
        iVar3 = Gia_ObjFanin0Copy(pObj);
        iVar4 = Gia_ObjFanin1Copy(pObj);
        if (iVar1 == 0) {
          uVar2 = Gia_ManHashAnd(pNew,iVar3,iVar4);
        }
        else {
          uVar2 = Gia_ManHashXorReal(pNew,iVar3,iVar4);
        }
      }
      else {
        pGVar6 = Gia_ObjFanin2(p,pObj);
        Dam_ManMultiAig_rec(pMan,pNew,p,pGVar6);
        iVar1 = Gia_ObjFanin2Copy(p,pObj);
        iVar3 = Gia_ObjFanin1Copy(pObj);
        iVar4 = Gia_ObjFanin0Copy(pObj);
        uVar2 = Gia_ManHashMuxReal(pNew,iVar1,iVar3,iVar4);
      }
      pObj->Value = uVar2;
      iVar1 = Abc_Lit2Var(uVar2);
      pGVar6 = Gia_ManObj(pNew,iVar1);
      Gia_ObjSetGateLevel(pNew,pGVar6);
      return;
    }
    iVar1 = Gia_ObjIsXor(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAndReal(p,pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x308,
                      "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
    }
    for (lVar7 = 1; lVar7 <= *piVar5; lVar7 = lVar7 + 1) {
      iVar1 = Abc_Lit2Var(piVar5[lVar7]);
      pGVar6 = Gia_ManObj(p,iVar1);
      Dam_ManMultiAig_rec(pMan,pNew,p,pGVar6);
      uVar2 = pGVar6->Value;
      iVar1 = Abc_LitIsCompl(piVar5[lVar7]);
      iVar1 = Abc_LitNotCond(uVar2,iVar1);
      piVar5[lVar7] = iVar1;
    }
    uVar2 = Gia_ManBalanceGate(pNew,pObj,p->vSuper,piVar5 + 1,*piVar5);
    pObj->Value = uVar2;
  }
  return;
}

Assistant:

void Dam_ManMultiAig_rec( Dam_Man_t * pMan, Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int i, * pSet;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pSet = Dam_ObjSet(pMan, Gia_ObjId(p, pObj));
    if ( pSet == NULL )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin2(p, pObj) );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    assert( Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj) );
    // call recursively
    for ( i = 1; i <= pSet[0]; i++ )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(pSet[i]) );
        Dam_ManMultiAig_rec( pMan, pNew, p, pTemp );
        pSet[i] = Abc_LitNotCond( pTemp->Value, Abc_LitIsCompl(pSet[i]) );
    }
    // create balanced gate
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, pSet + 1, pSet[0] );
}